

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpio.c
# Opt level: O0

void * pthSocketThread(void *x)

{
  FILE *pFVar1;
  int iVar2;
  char *pcVar3;
  socklen_t optlen;
  int optval;
  pthread_t thr;
  pthread_attr_t attr;
  sockaddr_storage client;
  int *sock;
  int c;
  int fdC;
  FILE *in_stack_fffffffffffffed0;
  undefined4 local_ec;
  sockaddr *local_e8;
  pthread_t local_e0;
  pthread_attr_t local_d8;
  sockaddr local_a0 [8];
  uint *local_20;
  socklen_t local_18;
  uint local_14;
  
  local_14 = 0;
  iVar2 = pthread_attr_init(&local_d8);
  pFVar1 = _stderr;
  if (iVar2 == 0) {
    iVar2 = pthread_attr_setstacksize(&local_d8,0x40000);
    pFVar1 = _stderr;
    if (iVar2 == 0) {
      iVar2 = pthread_attr_setdetachstate(&local_d8,1);
      pFVar1 = _stderr;
      if (iVar2 == 0) {
        listen(fdSock,100);
        local_18 = 0x80;
        spinWhileStarting();
        do {
          while( true ) {
            pFVar1 = _stderr;
            if ((int)local_14 < 0) {
              if (-1 < (int)local_14) {
                return (void *)0x0;
              }
              if ((gpioCfg.internals & 0x400) == 0) {
                pcVar3 = myTimeStamp();
                fprintf(pFVar1,"%s %s: accept failed (%m)\n",pcVar3,"pthSocketThread");
              }
              return (void *)0xffffffffffffffff;
            }
            local_e8 = local_a0;
            local_14 = accept(fdSock,local_e8,&local_18);
            closeOrphanedNotifications
                      ((int)((ulong)in_stack_fffffffffffffed0 >> 0x20),
                       (int)in_stack_fffffffffffffed0);
            iVar2 = addrAllowed((sockaddr *)local_a0);
            pFVar1 = _stderr;
            if (iVar2 != 0) break;
            if ((gpioCfg.internals & 0x400) == 0) {
              in_stack_fffffffffffffed0 = _stderr;
              pcVar3 = myTimeStamp();
              fprintf(in_stack_fffffffffffffed0,"%s %s: Connection rejected, closing\n",pcVar3,
                      "pthSocketThread");
            }
            close(local_14);
          }
          if ((gpioCfg.internals & 0x400) == 0) {
            pcVar3 = myTimeStamp();
            fprintf(pFVar1,"%s %s: Connection accepted on socket %d\n",pcVar3,"pthSocketThread",
                    (ulong)local_14);
          }
          local_20 = (uint *)malloc(4);
          *local_20 = local_14;
          local_ec = 1;
          iVar2 = setsockopt(local_14,1,9,&local_ec,4);
          pFVar1 = _stderr;
          if (iVar2 < 0) {
            if ((gpioCfg.internals & 0x400) == 0) {
              pcVar3 = myTimeStamp();
              fprintf(pFVar1,"%s %s: setsockopt() fail, closing socket %d\n",pcVar3,
                      "pthSocketThread",(ulong)local_14);
            }
            close(local_14);
          }
          pFVar1 = _stderr;
          if ((gpioCfg.internals & 0x400) == 0) {
            pcVar3 = myTimeStamp();
            fprintf(pFVar1,"%s %s: SO_KEEPALIVE enabled on socket %d\n\n",pcVar3,"pthSocketThread",
                    (ulong)local_14);
          }
          iVar2 = pthread_create(&local_e0,&local_d8,pthSocketThreadHandler,local_20);
          pFVar1 = _stderr;
        } while (-1 < iVar2);
        if ((gpioCfg.internals & 0x400) == 0) {
          pcVar3 = myTimeStamp();
          fprintf(pFVar1,"%s %s: socket pthread_create failed (%m)\n",pcVar3,"pthSocketThread");
        }
      }
      else if ((gpioCfg.internals & 0x400) == 0) {
        pcVar3 = myTimeStamp();
        fprintf(pFVar1,"%s %s: pthread_attr_setdetachstate failed (%m)\n",pcVar3,"pthSocketThread");
      }
    }
    else if ((gpioCfg.internals & 0x400) == 0) {
      pcVar3 = myTimeStamp();
      fprintf(pFVar1,"%s %s: pthread_attr_setstacksize failed (%m)\n",pcVar3,"pthSocketThread");
    }
  }
  else if ((gpioCfg.internals & 0x400) == 0) {
    pcVar3 = myTimeStamp();
    fprintf(pFVar1,"%s %s: pthread_attr_init failed (%m)\n",pcVar3,"pthSocketThread");
  }
  return (void *)0xffffffffffffffff;
}

Assistant:

static void * pthSocketThread(void *x)
{
   int fdC=0, c, *sock;
   struct sockaddr_storage client;
   pthread_attr_t attr;

   if (pthread_attr_init(&attr))
      SOFT_ERROR((void*)PI_INIT_FAILED,
         "pthread_attr_init failed (%m)");

   if (pthread_attr_setstacksize(&attr, STACK_SIZE))
      SOFT_ERROR((void*)PI_INIT_FAILED,
         "pthread_attr_setstacksize failed (%m)");

   if (pthread_attr_setdetachstate(&attr, PTHREAD_CREATE_DETACHED))
      SOFT_ERROR((void*)PI_INIT_FAILED,
         "pthread_attr_setdetachstate failed (%m)");

   /* fdSock opened in gpioInitialise so that we can treat
      failure to bind as fatal. */

   listen(fdSock, 100);

   c = sizeof(client);

   /* don't start until DMA started */

   spinWhileStarting();

   while (fdC >= 0)
   {
      pthread_t thr;

      fdC = accept(fdSock, (struct sockaddr *)&client, (socklen_t*)&c);

      closeOrphanedNotifications(-1, fdC);

      if (addrAllowed((struct sockaddr *)&client))
      {
         DBG(DBG_ALWAYS, "Connection accepted on socket %d", fdC);

         sock = malloc(sizeof(int));

         *sock = fdC;

         /* Enable tcp_keepalive */
         int optval = 1;
         socklen_t optlen = sizeof(optval);

         if (setsockopt(fdC, SOL_SOCKET, SO_KEEPALIVE, &optval, optlen) < 0) {
           DBG(0, "setsockopt() fail, closing socket %d", fdC);
           close(fdC);
         }

         DBG(DBG_ALWAYS, "SO_KEEPALIVE enabled on socket %d\n", fdC);

         if (pthread_create
            (&thr, &attr, pthSocketThreadHandler, (void*) sock) < 0)
            SOFT_ERROR((void*)PI_INIT_FAILED,
               "socket pthread_create failed (%m)");
      }
      else
      {
         DBG(DBG_ALWAYS, "Connection rejected, closing");
         close(fdC);
      }
   }

   if (fdC < 0)
      SOFT_ERROR((void*)PI_INIT_FAILED, "accept failed (%m)");

   return 0;
}